

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::ChannelList>::readValueFrom
          (TypedAttribute<Imf_3_4::ChannelList> *this,IStream *is,int size,int version)

{
  ulong uVar1;
  PixelType t;
  char cVar2;
  PixelType xs;
  ulong uVar3;
  ostream *poVar4;
  InputExc *this_00;
  int iVar5;
  long lVar6;
  bool pl;
  char name [256];
  char b [4];
  char local_538 [256];
  Channel local_438;
  ostream local_428 [1016];
  
  do {
    lVar6 = 0;
    do {
      (*is->_vptr_IStream[3])(is,local_538 + lVar6,1);
      cVar2 = local_538[0];
      if (local_538[lVar6] == '\0') break;
      iVar5 = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while (iVar5 != 0xff);
    if (local_538[0] == '\0') {
      return;
    }
    if (local_538[0] != '\0') {
      uVar3 = 0xffffffffffffffff;
      do {
        if (uVar3 == 0xfe) goto LAB_00159b3d;
        uVar1 = uVar3 + 1;
        lVar6 = uVar3 + 2;
        uVar3 = uVar1;
      } while (local_538[lVar6] != '\0');
      if (0xfe < uVar1) {
LAB_00159b3d:
        std::__cxx11::stringstream::stringstream((stringstream *)&local_438);
        std::__ostream_insert<char,std::char_traits<char>>(local_428,"Invalid ",8);
        std::__ostream_insert<char,std::char_traits<char>>(local_428,"channel name",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(local_428,": it is more than ",0x12);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_428);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," characters long.",0x11);
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(this_00,(stringstream *)&local_438);
        __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
    }
    (*is->_vptr_IStream[3])(is,&local_438,4);
    t = local_438.type;
    (*is->_vptr_IStream[3])(is,&local_438,1);
    pl = (undefined1)local_438.type != UINT;
    (*is->_vptr_IStream[3])(is,&local_438,3);
    (*is->_vptr_IStream[3])(is,&local_438,4);
    xs = local_438.type;
    (*is->_vptr_IStream[3])(is,&local_438,4);
    if (FLOAT < t) {
      t = NUM_PIXELTYPES;
    }
    Channel::Channel(&local_438,t,xs,local_438.type,pl);
    ChannelList::insert(&this->_value,local_538,&local_438);
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

IMF_EXPORT void
ChannelListAttribute::readValueFrom (IStream& is, int size, int version)
{
    while (true)
    {
        //
        // Read name; zero length name means end of channel list
        //

        char name[Name::SIZE];
        Xdr::read<StreamIO> (is, Name::MAX_LENGTH, name);

        if (name[0] == 0) break;

        checkIsNullTerminated (name, "channel name");

        //
        // Read Channel struct
        //

        int  type;
        bool pLinear;
        int  xSampling;
        int  ySampling;

        Xdr::read<StreamIO> (is, type);
        Xdr::read<StreamIO> (is, pLinear);
        Xdr::skip<StreamIO> (is, 3);
        Xdr::read<StreamIO> (is, xSampling);
        Xdr::read<StreamIO> (is, ySampling);

        //
        // prevent invalid values being written to PixelType enum
        // by forcing all unknown types to NUM_PIXELTYPES which is also an invalid
        // pixel type, but can be used as a PixelType enum value
        // (Header::sanityCheck will throw an exception when files with invalid PixelTypes are read)
        //
        if (type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
        {
            type = OPENEXR_IMF_INTERNAL_NAMESPACE::NUM_PIXELTYPES;
        }

        _value.insert (
            name, Channel (PixelType (type), xSampling, ySampling, pLinear));
    }
}